

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall
bidirectional::BiDirectional::updateBestLabels
          (BiDirectional *this,Directions *direction,Label *candidate_label)

{
  pointer pdVar1;
  byte bVar2;
  bool bVar3;
  Search *soft;
  pointer *ppdVar4;
  pointer pDVar5;
  __shared_ptr *p_Var6;
  element_type *peVar7;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  Label *in_RDI;
  bool stop;
  vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
  *best_labels;
  int *lemon_id;
  Search *search_ptr;
  Directions in_stack_ffffffffffffffb4;
  int iVar8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  byte bVar9;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  byte bVar10;
  Search *this_00;
  Label *this_01;
  
  this_01 = in_RDI;
  soft = getSearchPtr((BiDirectional *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                      ,in_stack_ffffffffffffffb4);
  ppdVar4 = &(in_RDX->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  this_00 = (Search *)&soft->best_labels;
  bVar10 = 0;
  bVar9 = 0;
  if (*(int *)&(in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start == 0) {
    iVar8 = *(int *)ppdVar4;
    pDVar5 = std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
             operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                         *)0x246dba);
    bVar9 = 0;
    if (iVar8 == (pDVar5->sink).lemon_id) {
      in_stack_ffffffffffffffce = 0;
      bVar3 = labelling::Label::checkFeasibility(this_01,in_RSI,in_RDX,(bool *)soft);
      bVar9 = bVar3 ^ 0xff;
    }
  }
  if ((bVar9 & 1) == 0) {
    bVar2 = 0;
    if (*(int *)&(in_RSI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start == 1) {
      iVar8 = *(int *)ppdVar4;
      pDVar5 = std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
               ::operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                             *)0x246e2c);
      bVar2 = 0;
      if (iVar8 == (pDVar5->source).lemon_id) {
        in_stack_ffffffffffffffcd = 0;
        bVar3 = labelling::Label::checkFeasibility(this_01,in_RSI,in_RDX,(bool *)soft);
        bVar2 = bVar3 ^ 0xff;
      }
    }
    if ((bVar2 & 1) != 0) {
      bVar10 = 1;
    }
  }
  else {
    bVar10 = 1;
  }
  if ((bVar10 & 1) != 0) {
    return;
  }
  p_Var6 = (__shared_ptr *)
           std::
           vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
           ::operator[]((vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                         *)this_00,(long)*(int *)ppdVar4);
  bVar3 = std::__shared_ptr::operator_cast_to_bool(p_Var6);
  if (bVar3) {
    pdVar1 = (in_RDX->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    std::
    vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>::
    operator[]((vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                *)this_00,(long)*(int *)ppdVar4);
    peVar7 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x246ec9);
    if ((double)pdVar1 < peVar7->weight) goto LAB_00246ef6;
  }
  p_Var6 = (__shared_ptr *)
           std::
           vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
           ::operator[]((vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                         *)this_00,(long)*(int *)ppdVar4);
  bVar3 = std::__shared_ptr::operator_cast_to_bool(p_Var6);
  if (bVar3) {
    return;
  }
LAB_00246ef6:
  Search::replaceBestLabel
            (this_00,(int *)CONCAT17(bVar10,CONCAT16(in_stack_ffffffffffffffce,
                                                     CONCAT15(in_stack_ffffffffffffffcd,
                                                              CONCAT14(bVar9,
                                                  in_stack_ffffffffffffffc8)))),in_RDI);
  return;
}

Assistant:

void BiDirectional::updateBestLabels(
    const Directions&       direction,
    const labelling::Label& candidate_label) {
  // Only save full paths when they are global resource feasible
  Search*    search_ptr = getSearchPtr(direction);
  const int& lemon_id   = candidate_label.vertex.lemon_id;
  std::vector<std::shared_ptr<labelling::Label>>& best_labels =
      search_ptr->best_labels;

  bool stop = false;
  if (direction == FWD && lemon_id == graph_ptr_->sink.lemon_id &&
      !candidate_label.checkFeasibility(max_res, min_res)) {
    stop = true;
  } else if (
      direction == BWD && lemon_id == graph_ptr_->source.lemon_id &&
      !candidate_label.checkFeasibility(max_res, min_res)) {
    stop = true;
  }
  if (stop) {
    SPDLOG_DEBUG("\t Label not globally feasible and not s-t path.");
    return;
  }
  // Update best_label only when new label has lower weight or first label
  if ((best_labels[lemon_id] &&
       candidate_label.weight < best_labels[lemon_id]->weight) ||
      !best_labels[lemon_id]) {
    search_ptr->replaceBestLabel(lemon_id, candidate_label);
    SPDLOG_DEBUG(
        "\t Vertex improvement with {}.",
        search_ptr->best_labels[lemon_id]->getString());
  }
}